

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

void ht_put(HashTable *ht,HTItemKey key,CrispyValue value)

{
  uint32_t uVar1;
  uint uVar2;
  HTItem *new_item_00;
  _Bool local_41;
  _Bool already_inside;
  HTItem *new_item;
  uint32_t index;
  HashTable *ht_local;
  CrispyValue value_local;
  HTItemKey key_local;
  
  uVar1 = hash(key,ht->key_type);
  uVar2 = uVar1 & ht->cap - 1;
  new_item_00 = (HTItem *)malloc(0x28);
  new_item_00->next = (table_item_t *)0x0;
  (new_item_00->key).field_0.key_ident_string = key.key_c_string;
  (new_item_00->key).field_0.ident_length = key.field_0.ident_length;
  *(ulong *)&new_item_00->value = CONCAT44(ht_local._4_4_,value.type);
  (new_item_00->value).field_1.p_value = (uint64_t)value.field_1;
  local_41 = false;
  if (ht->buckets[uVar2] == (HTItem *)0x0) {
    ht->buckets[uVar2] = new_item_00;
  }
  else {
    local_41 = insert(ht->buckets + uVar2,key,ht->key_type,new_item_00);
  }
  if (local_41 == false) {
    ht->size = ht->size + 1;
  }
  if (ht->cap < ht->size) {
    resize(ht);
  }
  return;
}

Assistant:

void ht_put(HashTable *ht, HTItemKey key, CrispyValue value) {
    uint32_t index = hash(key, ht->key_type) & (ht->cap - 1);
    HTItem *new_item = malloc(sizeof(HTItem));
    new_item->next = NULL;
    new_item->key = key;
    new_item->value = value;

    bool already_inside = false;
    if (ht->buckets[index] == NULL) {
        ht->buckets[index] = new_item;
    } else {
        already_inside = insert(&ht->buckets[index], key, ht->key_type, new_item);
    }

    if (!already_inside) {
        ++ht->size;
    }

    if (ht->size > ht->cap) {
        resize(ht);
    }
}